

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall ON_NurbsCage::Write(ON_NurbsCage *this,ON_BinaryArchive *archive)

{
  long lVar1;
  ON_NurbsCage *this_00;
  double *p;
  int j_00;
  int i_00;
  ON_BinaryArchive *pOVar2;
  bool bVar3;
  int iVar4;
  size_t count;
  double dStack_70;
  bool local_67;
  bool local_66;
  bool local_65;
  int local_64;
  ON_BinaryArchive *local_60;
  ON_BinaryArchive *local_58;
  ON_BinaryArchive *local_50;
  ON_NurbsCage *local_48;
  double *local_40;
  double *cv;
  double *bogus_cv;
  int local_28;
  int cv_dim;
  int k;
  int j;
  int i;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_NurbsCage *this_local;
  
  dStack_70 = 3.9231722326449e-317;
  local_48 = this;
  _i = archive;
  archive_local = (ON_BinaryArchive *)this;
  j._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if ((bool)j._3_1_) {
    dStack_70 = 3.92318754867992e-317;
    j._3_1_ = ON_BinaryArchive::WriteInt(_i,local_48->m_dim);
    if ((bool)j._3_1_) {
      dStack_70 = 3.92320335878059e-317;
      j._3_1_ = ON_BinaryArchive::WriteInt(_i,(uint)(local_48->m_is_rat & 1));
    }
    if ((bool)j._3_1_ != false) {
      dStack_70 = 3.92321669855302e-317;
      j._3_1_ = ON_BinaryArchive::WriteInt(_i,local_48->m_order[0]);
    }
    if ((bool)j._3_1_ != false) {
      dStack_70 = 3.92323003832546e-317;
      j._3_1_ = ON_BinaryArchive::WriteInt(_i,local_48->m_order[1]);
    }
    if ((bool)j._3_1_ != false) {
      dStack_70 = 3.9232433780979e-317;
      j._3_1_ = ON_BinaryArchive::WriteInt(_i,local_48->m_order[2]);
    }
    if ((bool)j._3_1_ != false) {
      dStack_70 = 3.92325671787034e-317;
      j._3_1_ = ON_BinaryArchive::WriteInt(_i,local_48->m_cv_count[0]);
    }
    if ((bool)j._3_1_ != false) {
      dStack_70 = 3.92327005764277e-317;
      j._3_1_ = ON_BinaryArchive::WriteInt(_i,local_48->m_cv_count[1]);
    }
    if ((bool)j._3_1_ != false) {
      dStack_70 = 3.92328339741521e-317;
      j._3_1_ = ON_BinaryArchive::WriteInt(_i,local_48->m_cv_count[2]);
    }
    if ((bool)j._3_1_ != false) {
      local_50 = _i;
      dStack_70 = 3.92329821938459e-317;
      iVar4 = KnotCount(local_48,0);
      dStack_70 = 3.9233090888288e-317;
      j._3_1_ = ON_BinaryArchive::WriteDouble(local_50,(long)iVar4,local_48->m_knot[0]);
    }
    if ((bool)j._3_1_ != false) {
      local_58 = _i;
      dStack_70 = 3.92332539299511e-317;
      iVar4 = KnotCount(local_48,1);
      dStack_70 = 3.92333626243932e-317;
      j._3_1_ = ON_BinaryArchive::WriteDouble(local_58,(long)iVar4,local_48->m_knot[1]);
    }
    if ((bool)j._3_1_ != false) {
      local_60 = _i;
      dStack_70 = 3.92335256660563e-317;
      iVar4 = KnotCount(local_48,2);
      dStack_70 = 3.92336343604984e-317;
      j._3_1_ = ON_BinaryArchive::WriteDouble(local_60,(long)iVar4,local_48->m_knot[2]);
    }
    if ((local_48->m_is_rat & 1U) == 0) {
      local_64 = local_48->m_dim;
    }
    else {
      local_64 = local_48->m_dim + 1;
    }
    bogus_cv._4_4_ = local_64;
    lVar1 = -((long)local_64 * 8 + 0xfU & 0xfffffffffffffff0);
    cv = (double *)(&stack0xffffffffffffff98 + lVar1);
    for (k = 0; k < local_64; k = k + 1) {
      cv[k] = -1.23432101234321e+308;
    }
    k = 0;
    while( true ) {
      pOVar2 = _i;
      local_65 = false;
      if (k < local_48->m_cv_count[0]) {
        local_65 = (bool)j._3_1_;
      }
      if (local_65 == false) break;
      cv_dim = 0;
      while( true ) {
        local_66 = false;
        if (cv_dim < local_48->m_cv_count[1]) {
          local_66 = (bool)j._3_1_;
        }
        if (local_66 == false) break;
        local_28 = 0;
        while( true ) {
          i_00 = k;
          j_00 = cv_dim;
          iVar4 = local_28;
          this_00 = local_48;
          local_67 = false;
          if (local_28 < local_48->m_cv_count[2]) {
            local_67 = (bool)j._3_1_;
          }
          if (local_67 == false) break;
          *(undefined8 *)((long)&dStack_70 + lVar1) = 0x792c74;
          local_40 = CV(this_00,i_00,j_00,iVar4);
          pOVar2 = _i;
          if (local_40 == (double *)0x0) {
            local_40 = cv;
          }
          p = local_40;
          count = (size_t)bogus_cv._4_4_;
          *(undefined8 *)((long)&dStack_70 + lVar1) = 0x792c98;
          j._3_1_ = ON_BinaryArchive::WriteDouble(pOVar2,count,p);
          local_28 = local_28 + 1;
        }
        cv_dim = cv_dim + 1;
      }
      k = k + 1;
    }
    *(undefined8 *)((long)&dStack_70 + lVar1) = 0x792cd1;
    bVar3 = ON_BinaryArchive::EndWrite3dmChunk(pOVar2);
    if (!bVar3) {
      j._3_1_ = 0;
    }
  }
  return (bool)(j._3_1_ & 1);
}

Assistant:

bool ON_NurbsCage::Write(ON_BinaryArchive& archive) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);

  if (rc)
  {
    rc = archive.WriteInt(m_dim);
    if(rc)
      rc = archive.WriteInt(m_is_rat);

    if (rc)
      rc = archive.WriteInt(m_order[0]);
    if (rc)
      rc = archive.WriteInt(m_order[1]);
    if (rc)
      rc = archive.WriteInt(m_order[2]);

    if (rc)
      rc = archive.WriteInt(m_cv_count[0]);
    if (rc)
      rc = archive.WriteInt(m_cv_count[1]);
    if (rc)
      rc = archive.WriteInt(m_cv_count[2]);

    if (rc)
      rc = archive.WriteDouble(KnotCount(0),m_knot[0]);
    if (rc)
      rc = archive.WriteDouble(KnotCount(1),m_knot[1]);
    if (rc)
      rc = archive.WriteDouble(KnotCount(2),m_knot[2]);

    int i,j,k;
    const int cv_dim = m_is_rat?(m_dim+1):m_dim;
    double* bogus_cv = (double*)alloca(cv_dim*sizeof(*bogus_cv));
    for ( i = 0; i < cv_dim; i++ )
      bogus_cv[i] = ON_UNSET_VALUE;
    for(i = 0; i < m_cv_count[0] && rc; i++)
    {
      for(j = 0; j < m_cv_count[1] && rc; j++)
      {
        for ( k = 0; k < m_cv_count[2] && rc; k++)
        {
          const double* cv = CV(i,j,k);
          if ( !cv )
            cv = bogus_cv;
          rc = archive.WriteDouble(cv_dim,cv);
        }
      }
    }

    if ( !archive.EndWrite3dmChunk() )
    {
      rc = false;
    }
  }

  return rc;
}